

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

bool __thiscall Clasp::ShortImplicationsGraph::Propagate::unary(Propagate *this,Literal p,Literal x)

{
  bool bVar1;
  Literal local_c;
  Antecedent local_8;
  
  bVar1 = true;
  if ((byte)(*(byte *)((long)(this->s->assign_).assign_.ebo_.buf + (ulong)(x.rep_ & 0xfffffffc)) & 3
            ) != (byte)(2U - ((x.rep_ & 2) == 0))) {
    local_8.data_ = (ulong)(p.rep_ >> 1) << 0x21 | 2;
    local_c.rep_ = x.rep_;
    bVar1 = Solver::force(this->s,&local_c,&local_8);
  }
  return bVar1;
}

Assistant:

bool unary(Literal p, Literal x) const { return s->isTrue(x) || s->force(x, Antecedent(p)); }